

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_pool_reset_aarch64(TCGContext_conflict1 *s)

{
  TCGPool *pTVar1;
  TCGPool *t;
  TCGPool *p;
  TCGContext_conflict1 *s_local;
  
  t = s->pool_first_large;
  while (t != (TCGPool *)0x0) {
    pTVar1 = t->next;
    g_free(t);
    t = pTVar1;
  }
  s->pool_first_large = (TCGPool *)0x0;
  s->pool_end = (uint8_t *)0x0;
  s->pool_cur = (uint8_t *)0x0;
  s->pool_current = (TCGPool *)0x0;
  return;
}

Assistant:

void tcg_pool_reset(TCGContext *s)
{
    TCGPool *p, *t;
    for (p = s->pool_first_large; p; p = t) {
        t = p->next;
        g_free(p);
    }
    s->pool_first_large = NULL;
    s->pool_cur = s->pool_end = NULL;
    s->pool_current = NULL;
}